

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O1

StructurePtr __thiscall soul::Module::Structs::find(Structs *this,string_view name)

{
  long lVar1;
  long lVar2;
  RefCountedPtr<soul::Structure> *pRVar3;
  int iVar4;
  void *in_RCX;
  Structure *__n;
  long lVar5;
  size_type __rlen;
  bool bVar6;
  
  __n = (Structure *)name._M_str;
  lVar1 = ((long *)name._M_len)[1];
  bVar6 = lVar1 == 0;
  if (!bVar6) {
    lVar2 = *(long *)name._M_len;
    lVar5 = 0;
    do {
      pRVar3 = *(RefCountedPtr<soul::Structure> **)(lVar2 + lVar5);
      if (pRVar3 == (RefCountedPtr<soul::Structure> *)0x0) {
        throwInternalCompilerError("object != nullptr","operator->",0x47);
      }
      if ((pRVar3[0x47].object == __n) &&
         ((__n == (Structure *)0x0 ||
          (iVar4 = bcmp(in_RCX,pRVar3[0x46].object,(size_t)__n), iVar4 == 0)))) {
        (this->structs).items = pRVar3;
        *(int *)&pRVar3->object = *(int *)&pRVar3->object + 1;
        if (!bVar6) {
          return (StructurePtr)(Structure *)this;
        }
        break;
      }
      lVar5 = lVar5 + 8;
      bVar6 = lVar1 << 3 == lVar5;
    } while (!bVar6);
  }
  (this->structs).items = (RefCountedPtr<soul::Structure> *)0x0;
  return (StructurePtr)(Structure *)this;
}

Assistant:

StructurePtr Module::Structs::find (std::string_view name) const noexcept
{
    for (auto& s : structs)
        if (name == s->getName())
            return s;

    return {};
}